

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

void __thiscall QtMWidgets::Slider::Slider(Slider *this,Orientation orientation,QWidget *parent)

{
  SliderPrivate *pSVar1;
  EVP_PKEY_CTX *ctx;
  QWidget *parent_local;
  Orientation orientation_local;
  Slider *this_local;
  
  QAbstractSlider::QAbstractSlider(&this->super_QAbstractSlider,parent);
  *(undefined ***)this = &PTR_metaObject_00245d38;
  *(undefined ***)&this->field_0x10 = &PTR__Slider_00245ef0;
  pSVar1 = (SliderPrivate *)operator_new(0x28);
  SliderPrivate::SliderPrivate(pSVar1,this);
  QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>::
  QScopedPointer(&this->d,pSVar1);
  ctx = (EVP_PKEY_CTX *)(ulong)orientation;
  QAbstractSlider::setOrientation((Orientation)this);
  pSVar1 = QScopedPointer<QtMWidgets::SliderPrivate,_QScopedPointerDeleter<QtMWidgets::SliderPrivate>_>
           ::operator->(&this->d);
  SliderPrivate::init(pSVar1,ctx);
  return;
}

Assistant:

Slider::Slider( Qt::Orientation orientation, QWidget * parent )
	:	QAbstractSlider( parent )
	,	d( new SliderPrivate( this ) )
{
	setOrientation( orientation );
	d->init();
}